

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.h
# Opt level: O2

void __thiscall
DateTime::Initialise
          (DateTime *this,int year,int month,int day,int hour,int minute,int second,int microsecond)

{
  bool bVar1;
  int days;
  int64_t in_RAX;
  DateTime local_38;
  
  local_38.m_encoded = in_RAX;
  bVar1 = IsValidYearMonthDay(year,month,day);
  if (((((uint)microsecond < 1000000) && ((uint)second < 0x3c)) && ((uint)minute < 0x3c)) &&
     (((uint)hour < 0x18 && (bVar1)))) {
    days = AbsoluteDays(this,year,month,day);
    TimeSpan::CalculateTicks((TimeSpan *)&local_38,days,hour,minute,second,microsecond);
    this->m_encoded = (int64_t)local_38;
    return;
  }
  __assert_fail("false && \"Invalid date\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/enferex[P]satnow/third-party/sgp4/libsgp4/DateTime.h"
                ,0x7f,"void DateTime::Initialise(int, int, int, int, int, int, int)");
}

Assistant:

void Initialise(int year,
            int month,
            int day,
            int hour,
            int minute,
            int second,
            int microsecond)
    {
        if (!IsValidYearMonthDay(year, month, day) ||
                hour < 0 || hour > 23 ||
                minute < 0 || minute > 59 ||
                second < 0 || second > 59 ||
                microsecond < 0 || microsecond > 999999)
        {
            assert(false && "Invalid date");
        }
        m_encoded = TimeSpan(
                AbsoluteDays(year, month, day),
                hour,
                minute,
                second,
                microsecond).Ticks();
    }